

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::XmlReporter::test_run_end(XmlReporter *this,TestRunStats *p)

{
  ScopedElement *this_00;
  XmlWriter *pXVar1;
  uint local_148;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  uint local_f8;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  int local_80;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40 [32];
  pointer local_18;
  TestRunStats *p_local;
  XmlReporter *this_local;
  
  local_18 = (pointer)p;
  p_local = (TestRunStats *)this;
  if (this->tc != (TestCaseData *)0x0) {
    XmlWriter::endElement(&this->xml);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"OverallResultsAsserts",&local_41);
  XmlWriter::scopedElement((XmlWriter *)&stack0xffffffffffffffe0,(string *)&this->xml);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"successes",&local_79);
  local_80 = *(int *)&local_18->field_2 - *(int *)((long)&local_18->field_2 + 4);
  this_00 = XmlWriter::ScopedElement::writeAttribute<int>
                      ((ScopedElement *)&stack0xffffffffffffffe0,&local_78,&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"failures",&local_a1);
  XmlWriter::ScopedElement::writeAttribute<int>
            (this_00,&local_a0,(int *)((local_18->field_2)._M_local_buf + 4));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffe0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"OverallResultsTestCases",&local_c9);
  pXVar1 = XmlWriter::startElement(&this->xml,&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"successes",&local_f1);
  local_f8 = *(uint *)&local_18->field_0x4 - *(uint *)((long)&local_18->_M_string_length + 4);
  pXVar1 = XmlWriter::writeAttribute<unsigned_int>(pXVar1,&local_f0,&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"failures",&local_119);
  XmlWriter::writeAttribute<unsigned_int>
            (pXVar1,&local_118,(uint *)((long)&local_18->_M_string_length + 4));
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  if ((this->opt->no_skipped_summary & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"skipped",&local_141);
    local_148 = *(int *)local_18 - *(uint *)&local_18->field_0x4;
    XmlWriter::writeAttribute<unsigned_int>(&this->xml,&local_140,&local_148);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  XmlWriter::endElement(&this->xml);
  XmlWriter::endElement(&this->xml);
  return;
}

Assistant:

void test_run_end(const TestRunStats& p) override {
            if(tc) // the TestSuite tag - only if there has been at least 1 test case
                xml.endElement();

            xml.scopedElement("OverallResultsAsserts")
                    .writeAttribute("successes", p.numAsserts - p.numAssertsFailed)
                    .writeAttribute("failures", p.numAssertsFailed);

            xml.startElement("OverallResultsTestCases")
                    .writeAttribute("successes",
                                    p.numTestCasesPassingFilters - p.numTestCasesFailed)
                    .writeAttribute("failures", p.numTestCasesFailed);
            if(opt.no_skipped_summary == false)
                xml.writeAttribute("skipped", p.numTestCases - p.numTestCasesPassingFilters);
            xml.endElement();

            xml.endElement();
        }